

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

bool __thiscall inja::Parser::parse_expression_comparison(Parser *this,Template *tmpl)

{
  Token *pTVar1;
  size_t sVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  Op op;
  Token local_48;
  
  bVar4 = parse_expression_datum(this,tmpl);
  if (bVar4) {
    bVar4 = true;
    switch((this->m_tok).kind) {
    case Id:
      if ((this->m_tok).text._M_len != 2) {
        return true;
      }
      iVar5 = bcmp((this->m_tok).text._M_str,"in",2);
      if (iVar5 != 0) {
        return true;
      }
      op = In;
      break;
    default:
      goto switchD_00119fcd_caseD_a;
    case Equal:
      op = Equal;
      break;
    case GreaterThan:
      op = Greater;
      break;
    case GreaterEqual:
      op = GreaterEqual;
      break;
    case LessThan:
      op = Less;
      break;
    case LessEqual:
      op = LessEqual;
      break;
    case NotEqual:
      op = Different;
    }
    pTVar1 = &this->m_tok;
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text._M_str = (this->m_peek_tok).text._M_str;
      uVar3 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
      sVar2 = (this->m_peek_tok).text._M_len;
      pTVar1->kind = (this->m_peek_tok).kind;
      *(undefined4 *)&pTVar1->field_0x4 = uVar3;
      (this->m_tok).text._M_len = sVar2;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan(&local_48,&this->m_lexer);
      (this->m_tok).text._M_str = local_48.text._M_str;
      pTVar1->kind = local_48.kind;
      *(undefined4 *)&pTVar1->field_0x4 = local_48._4_4_;
      (this->m_tok).text._M_len = local_48.text._M_len;
    }
    bVar4 = parse_expression_datum(this,tmpl);
    if (bVar4) {
      append_function(this,tmpl,op,2);
      return true;
    }
  }
  bVar4 = false;
switchD_00119fcd_caseD_a:
  return bVar4;
}

Assistant:

bool parse_expression_comparison(Template& tmpl) {
    if (!parse_expression_datum(tmpl)) return false;
    Bytecode::Op op;
    switch (m_tok.kind) {
      case Token::Kind::Id:
        if (m_tok.text == static_cast<decltype(m_tok.text)>("in"))
          op = Bytecode::Op::In;
        else
          return true;
        break;
      case Token::Kind::Equal:
        op = Bytecode::Op::Equal;
        break;
      case Token::Kind::GreaterThan:
        op = Bytecode::Op::Greater;
        break;
      case Token::Kind::LessThan:
        op = Bytecode::Op::Less;
        break;
      case Token::Kind::LessEqual:
        op = Bytecode::Op::LessEqual;
        break;
      case Token::Kind::GreaterEqual:
        op = Bytecode::Op::GreaterEqual;
        break;
      case Token::Kind::NotEqual:
        op = Bytecode::Op::Different;
        break;
      default:
        return true;
    }
    get_next_token();
    if (!parse_expression_datum(tmpl)) return false;
    append_function(tmpl, op, 2);
    return true;
  }